

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

ModelPtr __thiscall libcellml::AnyCellmlElement::model(AnyCellmlElement *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  shared_ptr<libcellml::Model> sVar2;
  ModelPtr MVar3;
  bad_any_cast *anon_var_0;
  AnyCellmlElement *this_local;
  
  if ((*(int *)*in_RSI == 3) || (*(int *)*in_RSI == 7)) {
    sVar2 = std::any_cast<std::shared_ptr<libcellml::Model>>((any *)this);
    _Var1 = sVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
  }
  else {
    std::shared_ptr<libcellml::Model>::shared_ptr
              ((shared_ptr<libcellml::Model> *)this,(nullptr_t)0x0);
    _Var1._M_pi = extraout_RDX;
  }
  MVar3.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  MVar3.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar3.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr AnyCellmlElement::model() const
{
    if ((mPimpl->mType == CellmlElementType::ENCAPSULATION)
        || (mPimpl->mType == CellmlElementType::MODEL)) {
        try {
            return std::any_cast<ModelPtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}